

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

void __thiscall OrgData::GetMusicInfo(OrgData *this,MUSICINFO *mi)

{
  int local_1c;
  int i;
  MUSICINFO *mi_local;
  OrgData *this_local;
  
  mi->dot = (this->info).dot;
  mi->line = (this->info).line;
  mi->alloc_note = (this->info).alloc_note;
  mi->wait = (this->info).wait;
  mi->repeat_x = (this->info).repeat_x;
  mi->end_x = (this->info).end_x;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    mi->tdata[local_1c].freq = (this->info).tdata[local_1c].freq;
    mi->tdata[local_1c].wave_no = (this->info).tdata[local_1c].wave_no;
    mi->tdata[local_1c].pipi = (this->info).tdata[local_1c].pipi;
  }
  return;
}

Assistant:

void OrgData::GetMusicInfo(MUSICINFO *mi)
{
	mi->dot = info.dot;
	mi->line = info.line;
	mi->alloc_note = info.alloc_note;
	mi->wait = info.wait;
	mi->repeat_x = info.repeat_x;
	mi->end_x = info.end_x;

	for (int i = 0; i < MAXTRACK; i++)
	{
		mi->tdata[i].freq = info.tdata[i].freq;
		mi->tdata[i].wave_no = info.tdata[i].wave_no;
		mi->tdata[i].pipi = info.tdata[i].pipi;
	}
}